

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O3

void initial_load_test_nested_common_prefix(void)

{
  uint32_t uVar1;
  hbtrie_result hVar2;
  int iVar3;
  filemgr_ops *pfVar4;
  filemgr *pfVar5;
  bid_t bVar6;
  list_elem *plVar7;
  list_elem *plVar8;
  list_elem *plVar9;
  btree_blk_ops *pbVar10;
  size_t sVar11;
  initial_load_elem *ile;
  long lVar12;
  char *pcVar13;
  long lVar14;
  filemgr_open_result fVar15;
  docio_object dStack_1898;
  list lStack_1858;
  ulong uStack_1848;
  docio_handle dStack_1840;
  timeval tStack_1800;
  btreeblk_handle bStack_17f0;
  hbtrie hStack_1778;
  char acStack_1708 [9];
  undefined7 uStack_16ff;
  undefined1 uStack_16f8;
  char acStack_16f7 [239];
  filemgr_config fStack_1608;
  char acStack_15a8 [256];
  char acStack_14a8 [256];
  undefined1 auStack_13a8 [256];
  undefined1 auStack_12a8 [256];
  undefined1 auStack_11a8 [240];
  undefined8 uStack_10b8;
  docio_object dStack_1060;
  list lStack_1020;
  ulong uStack_1010;
  docio_handle dStack_1008;
  timeval tStack_fc8;
  btreeblk_handle bStack_fb8;
  hbtrie hStack_f40;
  undefined8 uStack_ed0;
  undefined1 uStack_ec8;
  undefined1 auStack_ec7 [247];
  filemgr_config fStack_dd0;
  char acStack_d70 [256];
  char acStack_c70 [256];
  undefined1 auStack_b70 [256];
  undefined1 auStack_a70 [256];
  undefined1 auStack_970 [240];
  undefined8 uStack_880;
  long local_838;
  docio_object local_828;
  list entries;
  uint8_t valuebuf [8];
  docio_handle dhandle;
  timeval __test_begin;
  btreeblk_handle bhandle;
  hbtrie trie;
  filemgr_config local_698;
  char body [256];
  char meta [256];
  char dockey [256];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  system("rm -rf  hbtrie_testfile");
  local_828.timestamp = 0;
  local_828._20_4_ = 0;
  local_828.length.keylen = 0;
  local_828.length.metalen = 0;
  local_828.length.bodylen = 0;
  local_828.length.bodylen_ondisk = 0;
  local_828.length.flag = '\0';
  local_828.length.checksum = '\0';
  local_828.length.reserved = 0;
  local_828.field_3.seqnum = 0;
  local_828.key = keybuf;
  local_828.meta = metabuf;
  local_828.body = bodybuf;
  local_698.prefetch_duration = 0;
  local_698.encryption_key.bytes[0] = '\0';
  local_698.encryption_key.bytes[1] = '\0';
  local_698.encryption_key.bytes[2] = '\0';
  local_698.encryption_key.bytes[3] = '\0';
  local_698.encryption_key.bytes[4] = '\0';
  local_698.encryption_key.bytes[5] = '\0';
  local_698.encryption_key.bytes[6] = '\0';
  local_698.encryption_key.bytes[7] = '\0';
  local_698.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_698.do_not_cache_doc_blocks = false;
  local_698._89_3_ = 0;
  local_698.num_blocks_readahead = 0;
  local_698.encryption_key.bytes[0x18] = '\0';
  local_698.encryption_key.bytes[0x19] = '\0';
  local_698.encryption_key.bytes[0x1a] = '\0';
  local_698.encryption_key.bytes[0x1b] = '\0';
  local_698.encryption_key.bytes[0x1c] = '\0';
  local_698.encryption_key.bytes[0x1d] = '\0';
  local_698.encryption_key.bytes[0x1e] = '\0';
  local_698.encryption_key.bytes[0x1f] = '\0';
  local_698.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_698.encryption_key.bytes[8] = '\0';
  local_698.encryption_key.bytes[9] = '\0';
  local_698.encryption_key.bytes[10] = '\0';
  local_698.encryption_key.bytes[0xb] = '\0';
  local_698.encryption_key.bytes[0xc] = '\0';
  local_698.encryption_key.bytes[0xd] = '\0';
  local_698.encryption_key.bytes[0xe] = '\0';
  local_698.encryption_key.bytes[0xf] = '\0';
  local_698.encryption_key.bytes[0x10] = '\0';
  local_698.encryption_key.bytes[0x11] = '\0';
  local_698.encryption_key.bytes[0x12] = '\0';
  local_698.encryption_key.bytes[0x13] = '\0';
  local_698.encryption_key.bytes[0x14] = '\0';
  local_698.encryption_key.bytes[0x15] = '\0';
  local_698.encryption_key.bytes[0x16] = '\0';
  local_698.encryption_key.bytes[0x17] = '\0';
  local_698.blocksize = 0x1000;
  local_698.ncacheblock = 0;
  local_698.flag = 0;
  local_698.chunksize = 8;
  local_698.options = '\b';
  local_698.seqtree_opt = '\0';
  local_698._18_6_ = 0;
  local_698.num_wal_shards = 8;
  local_698.num_bcache_shards = 0;
  local_698.encryption_key.algorithm = 0;
  pfVar4 = get_filemgr_ops();
  fVar15 = filemgr_open("./hbtrie_testfile",pfVar4,&local_698,(err_log_callback *)0x0);
  pfVar5 = fVar15.file;
  docio_init(&dhandle,pfVar5,false);
  btreeblk_init(&bhandle,pfVar5,0x1000);
  entries.head = (list_elem *)0x0;
  entries.tail = (list_elem *)0x0;
  local_838 = 0;
  do {
    lVar12 = 0;
    do {
      sprintf(dockey,"00000000%08zu%08zuabc",local_838,lVar12);
      sprintf(meta,"metadata_%03zu",lVar12);
      sprintf(body,"body_%03zu",lVar12);
      uVar1 = _set_doc(&local_828,dockey,meta,body);
      if (uVar1 == 0) {
        initial_load_test_nested_common_prefix();
        goto LAB_00109104;
      }
      bVar6 = docio_append_doc(&dhandle,&local_828,'\0','\0');
      plVar7 = (list_elem *)malloc(0x28);
      plVar8 = (list_elem *)strlen(dockey);
      plVar7[1].next = plVar8;
      plVar9 = (list_elem *)malloc((size_t)plVar8);
      plVar7[1].prev = plVar9;
      memcpy(plVar9,dockey,(size_t)plVar8);
      plVar7[2].prev =
           (list_elem *)
           (bVar6 >> 0x38 | (bVar6 & 0xff000000000000) >> 0x28 | (bVar6 & 0xff0000000000) >> 0x18 |
            (bVar6 & 0xff00000000) >> 8 | (bVar6 & 0xff000000) << 8 | (bVar6 & 0xff0000) << 0x18 |
            (bVar6 & 0xff00) << 0x28 | bVar6 << 0x38);
      list_push_back(&entries,plVar7);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 1000);
    local_838 = local_838 + 1;
  } while (local_838 != 10);
  pbVar10 = btreeblk_get_ops();
  uStack_880 = 0x108ee4;
  hbtrie_init_and_load
            (&trie,8,8,0x1000,0xffffffffffffffff,&bhandle,pbVar10,&dhandle,_readkey_wrap,10000,
             initial_load_next,initial_load_get,initial_btreeblk_end,&entries);
  filemgr_commit(pfVar5,true,(err_log_callback *)0x0);
  printf("trie root bid %lu\n",trie.root_bid);
  lVar12 = 0;
  do {
    lVar14 = 0;
    do {
      sprintf(dockey,"00000000%08zu%08zuabc",lVar12,lVar14);
      sprintf(meta,"metadata_%03zu",lVar14);
      sprintf(body,"body_%03zu",lVar14);
      sVar11 = strlen(dockey);
      hVar2 = hbtrie_find(&trie,dockey,(int)sVar11,valuebuf);
      btreeblk_end(&bhandle);
      if (hVar2 == HBTRIE_RESULT_FAIL) goto LAB_00109104;
      docio_read_doc(&dhandle,(ulong)valuebuf >> 0x38 | ((ulong)valuebuf & 0xff000000000000) >> 0x28
                              | ((ulong)valuebuf & 0xff0000000000) >> 0x18 |
                              ((ulong)valuebuf & 0xff00000000) >> 8 |
                              ((ulong)valuebuf & 0xff000000) << 8 |
                              ((ulong)valuebuf & 0xff0000) << 0x18 |
                              ((ulong)valuebuf & 0xff00) << 0x28 | (long)valuebuf << 0x38,&local_828
                     ,true);
      iVar3 = bcmp(local_828.key,dockey,local_828.length._0_8_ & 0xffff);
      if (iVar3 != 0) {
        initial_load_test_nested_common_prefix();
      }
      iVar3 = bcmp(local_828.meta,meta,(ulong)local_828.length._0_8_ >> 0x10 & 0xffff);
      if (iVar3 != 0) {
        initial_load_test_nested_common_prefix();
      }
      iVar3 = bcmp(local_828.body,body,(ulong)local_828.length._0_8_ >> 0x20);
      if (iVar3 != 0) {
        initial_load_test_nested_common_prefix();
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 1000);
    lVar12 = lVar12 + 1;
    if (lVar12 == 10) {
      hbtrie_free(&trie);
      docio_free(&dhandle);
      btreeblk_free(&bhandle);
      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      plVar7 = entries.head;
      while (plVar7 != (list_elem *)0x0) {
        plVar8 = plVar7->next;
        free(plVar7[1].prev);
        free(plVar7);
        plVar7 = plVar8;
      }
      pcVar13 = "%s PASSED\n";
      if (initial_load_test_nested_common_prefix()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar13,"initial load with nested common prefix test");
      return;
    }
  } while( true );
LAB_00109104:
  initial_load_test_nested_common_prefix();
  gettimeofday(&tStack_fc8,(__timezone_ptr_t)0x0);
  system("rm -rf  hbtrie_testfile");
  dStack_1060.timestamp = 0;
  dStack_1060._20_4_ = 0;
  dStack_1060.length.keylen = 0;
  dStack_1060.length.metalen = 0;
  dStack_1060.length.bodylen = 0;
  dStack_1060.length.bodylen_ondisk = 0;
  dStack_1060.length.flag = '\0';
  dStack_1060.length.checksum = '\0';
  dStack_1060.length.reserved = 0;
  dStack_1060.field_3.seqnum = 0;
  dStack_1060.key = auStack_970;
  dStack_1060.meta = auStack_a70;
  dStack_1060.body = auStack_b70;
  fStack_dd0.prefetch_duration = 0;
  fStack_dd0.encryption_key.bytes[0] = '\0';
  fStack_dd0.encryption_key.bytes[1] = '\0';
  fStack_dd0.encryption_key.bytes[2] = '\0';
  fStack_dd0.encryption_key.bytes[3] = '\0';
  fStack_dd0.encryption_key.bytes[4] = '\0';
  fStack_dd0.encryption_key.bytes[5] = '\0';
  fStack_dd0.encryption_key.bytes[6] = '\0';
  fStack_dd0.encryption_key.bytes[7] = '\0';
  fStack_dd0.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fStack_dd0.do_not_cache_doc_blocks = false;
  fStack_dd0._89_3_ = 0;
  fStack_dd0.num_blocks_readahead = 0;
  fStack_dd0.encryption_key.bytes[0x18] = '\0';
  fStack_dd0.encryption_key.bytes[0x19] = '\0';
  fStack_dd0.encryption_key.bytes[0x1a] = '\0';
  fStack_dd0.encryption_key.bytes[0x1b] = '\0';
  fStack_dd0.encryption_key.bytes[0x1c] = '\0';
  fStack_dd0.encryption_key.bytes[0x1d] = '\0';
  fStack_dd0.encryption_key.bytes[0x1e] = '\0';
  fStack_dd0.encryption_key.bytes[0x1f] = '\0';
  fStack_dd0.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fStack_dd0.encryption_key.bytes[8] = '\0';
  fStack_dd0.encryption_key.bytes[9] = '\0';
  fStack_dd0.encryption_key.bytes[10] = '\0';
  fStack_dd0.encryption_key.bytes[0xb] = '\0';
  fStack_dd0.encryption_key.bytes[0xc] = '\0';
  fStack_dd0.encryption_key.bytes[0xd] = '\0';
  fStack_dd0.encryption_key.bytes[0xe] = '\0';
  fStack_dd0.encryption_key.bytes[0xf] = '\0';
  fStack_dd0.encryption_key.bytes[0x10] = '\0';
  fStack_dd0.encryption_key.bytes[0x11] = '\0';
  fStack_dd0.encryption_key.bytes[0x12] = '\0';
  fStack_dd0.encryption_key.bytes[0x13] = '\0';
  fStack_dd0.encryption_key.bytes[0x14] = '\0';
  fStack_dd0.encryption_key.bytes[0x15] = '\0';
  fStack_dd0.encryption_key.bytes[0x16] = '\0';
  fStack_dd0.encryption_key.bytes[0x17] = '\0';
  fStack_dd0.blocksize = 0x1000;
  fStack_dd0.ncacheblock = 0;
  fStack_dd0.flag = 0;
  fStack_dd0.chunksize = 8;
  fStack_dd0.options = '\b';
  fStack_dd0.seqtree_opt = '\0';
  fStack_dd0._18_6_ = 0;
  fStack_dd0.num_wal_shards = 8;
  fStack_dd0.num_bcache_shards = 0;
  fStack_dd0.encryption_key.algorithm = 0;
  pfVar4 = get_filemgr_ops();
  fVar15 = filemgr_open("./hbtrie_testfile",pfVar4,&fStack_dd0,(err_log_callback *)0x0);
  pfVar5 = fVar15.file;
  docio_init(&dStack_1008,pfVar5,false);
  btreeblk_init(&bStack_fb8,pfVar5,0x1000);
  memset(auStack_ec7,0,0xf7);
  uStack_ed0 = 0x3030303030303030;
  uStack_ec8 = 0;
  lStack_1020.head = (list_elem *)0x0;
  lStack_1020.tail = (list_elem *)0x0;
  lVar12 = 0;
  do {
    sprintf(acStack_c70,"metadata_%03zu",lVar12);
    sprintf(acStack_d70,"body_%03zu",lVar12);
    uVar1 = _set_doc_bin(&dStack_1060,(char *)&uStack_ed0,lVar12 + 8,acStack_c70,acStack_d70);
    if (uVar1 == 0) {
      initial_load_test_tailing_null();
      goto LAB_0010954b;
    }
    bVar6 = docio_append_doc(&dStack_1008,&dStack_1060,'\0','\0');
    plVar7 = (list_elem *)malloc(0x28);
    plVar9 = (list_elem *)(dStack_1060.length._0_8_ & 0xffff);
    plVar7[1].next = plVar9;
    plVar8 = (list_elem *)malloc((size_t)plVar9);
    plVar7[1].prev = plVar8;
    memcpy(plVar8,&uStack_ed0,(size_t)plVar9);
    plVar7[2].prev =
         (list_elem *)
         (bVar6 >> 0x38 | (bVar6 & 0xff000000000000) >> 0x28 | (bVar6 & 0xff0000000000) >> 0x18 |
          (bVar6 & 0xff00000000) >> 8 | (bVar6 & 0xff000000) << 8 | (bVar6 & 0xff0000) << 0x18 |
          (bVar6 & 0xff00) << 0x28 | bVar6 << 0x38);
    list_push_back(&lStack_1020,plVar7);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 8);
  pbVar10 = btreeblk_get_ops();
  uStack_10b8 = 0x10935a;
  hbtrie_init_and_load
            (&hStack_f40,8,8,0x1000,0xffffffffffffffff,&bStack_fb8,pbVar10,&dStack_1008,
             _readkey_wrap,8,initial_load_next,initial_load_get,initial_btreeblk_end,&lStack_1020);
  filemgr_commit(pfVar5,true,(err_log_callback *)0x0);
  printf("trie root bid %lu\n",hStack_f40.root_bid);
  lVar12 = 0;
  while( true ) {
    sprintf(acStack_c70,"metadata_%03zu",lVar12);
    sprintf(acStack_d70,"body_%03zu",lVar12);
    hVar2 = hbtrie_find(&hStack_f40,&uStack_ed0,(int)lVar12 + 8,&uStack_1010);
    btreeblk_end(&bStack_fb8);
    if (hVar2 == HBTRIE_RESULT_FAIL) break;
    docio_read_doc(&dStack_1008,
                   uStack_1010 >> 0x38 | (uStack_1010 & 0xff000000000000) >> 0x28 |
                   (uStack_1010 & 0xff0000000000) >> 0x18 | (uStack_1010 & 0xff00000000) >> 8 |
                   (uStack_1010 & 0xff000000) << 8 | (uStack_1010 & 0xff0000) << 0x18 |
                   (uStack_1010 & 0xff00) << 0x28 | uStack_1010 << 0x38,&dStack_1060,true);
    iVar3 = bcmp(dStack_1060.key,&uStack_ed0,dStack_1060.length._0_8_ & 0xffff);
    if (iVar3 != 0) {
      initial_load_test_tailing_null();
    }
    iVar3 = bcmp(dStack_1060.meta,acStack_c70,(ulong)dStack_1060.length._0_8_ >> 0x10 & 0xffff);
    if (iVar3 != 0) {
      initial_load_test_tailing_null();
    }
    iVar3 = bcmp(dStack_1060.body,acStack_d70,(ulong)dStack_1060.length._0_8_ >> 0x20);
    if (iVar3 != 0) {
      initial_load_test_tailing_null();
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 8) {
      hbtrie_free(&hStack_f40);
      docio_free(&dStack_1008);
      btreeblk_free(&bStack_fb8);
      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      plVar7 = lStack_1020.head;
      while (plVar7 != (list_elem *)0x0) {
        plVar8 = plVar7->next;
        free(plVar7[1].prev);
        free(plVar7);
        plVar7 = plVar8;
      }
      pcVar13 = "%s PASSED\n";
      if (initial_load_test_tailing_null()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar13,"initial load with tailing null test");
      return;
    }
  }
LAB_0010954b:
  initial_load_test_tailing_null();
  gettimeofday(&tStack_1800,(__timezone_ptr_t)0x0);
  system("rm -rf  hbtrie_testfile");
  dStack_1898.timestamp = 0;
  dStack_1898._20_4_ = 0;
  dStack_1898.length.keylen = 0;
  dStack_1898.length.metalen = 0;
  dStack_1898.length.bodylen = 0;
  dStack_1898.length.bodylen_ondisk = 0;
  dStack_1898.length.flag = '\0';
  dStack_1898.length.checksum = '\0';
  dStack_1898.length.reserved = 0;
  dStack_1898.field_3.seqnum = 0;
  dStack_1898.key = auStack_11a8;
  dStack_1898.meta = auStack_12a8;
  dStack_1898.body = auStack_13a8;
  fStack_1608.prefetch_duration = 0;
  fStack_1608.encryption_key.bytes[0] = '\0';
  fStack_1608.encryption_key.bytes[1] = '\0';
  fStack_1608.encryption_key.bytes[2] = '\0';
  fStack_1608.encryption_key.bytes[3] = '\0';
  fStack_1608.encryption_key.bytes[4] = '\0';
  fStack_1608.encryption_key.bytes[5] = '\0';
  fStack_1608.encryption_key.bytes[6] = '\0';
  fStack_1608.encryption_key.bytes[7] = '\0';
  fStack_1608.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fStack_1608.do_not_cache_doc_blocks = false;
  fStack_1608._89_3_ = 0;
  fStack_1608.num_blocks_readahead = 0;
  fStack_1608.encryption_key.bytes[0x18] = '\0';
  fStack_1608.encryption_key.bytes[0x19] = '\0';
  fStack_1608.encryption_key.bytes[0x1a] = '\0';
  fStack_1608.encryption_key.bytes[0x1b] = '\0';
  fStack_1608.encryption_key.bytes[0x1c] = '\0';
  fStack_1608.encryption_key.bytes[0x1d] = '\0';
  fStack_1608.encryption_key.bytes[0x1e] = '\0';
  fStack_1608.encryption_key.bytes[0x1f] = '\0';
  fStack_1608.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fStack_1608.encryption_key.bytes[8] = '\0';
  fStack_1608.encryption_key.bytes[9] = '\0';
  fStack_1608.encryption_key.bytes[10] = '\0';
  fStack_1608.encryption_key.bytes[0xb] = '\0';
  fStack_1608.encryption_key.bytes[0xc] = '\0';
  fStack_1608.encryption_key.bytes[0xd] = '\0';
  fStack_1608.encryption_key.bytes[0xe] = '\0';
  fStack_1608.encryption_key.bytes[0xf] = '\0';
  fStack_1608.encryption_key.bytes[0x10] = '\0';
  fStack_1608.encryption_key.bytes[0x11] = '\0';
  fStack_1608.encryption_key.bytes[0x12] = '\0';
  fStack_1608.encryption_key.bytes[0x13] = '\0';
  fStack_1608.encryption_key.bytes[0x14] = '\0';
  fStack_1608.encryption_key.bytes[0x15] = '\0';
  fStack_1608.encryption_key.bytes[0x16] = '\0';
  fStack_1608.encryption_key.bytes[0x17] = '\0';
  fStack_1608.blocksize = 0x1000;
  fStack_1608.ncacheblock = 0;
  fStack_1608.flag = 0;
  fStack_1608.chunksize = 8;
  fStack_1608.options = '\b';
  fStack_1608.seqtree_opt = '\0';
  fStack_1608._18_6_ = 0;
  fStack_1608.num_wal_shards = 8;
  fStack_1608.num_bcache_shards = 0;
  fStack_1608.encryption_key.algorithm = 0;
  pfVar4 = get_filemgr_ops();
  fVar15 = filemgr_open("./hbtrie_testfile",pfVar4,&fStack_1608,(err_log_callback *)0x0);
  pfVar5 = fVar15.file;
  docio_init(&dStack_1840,pfVar5,false);
  btreeblk_init(&bStack_17f0,pfVar5,0x1000);
  memset(acStack_16f7 + 8,0,0xe7);
  builtin_strncpy(acStack_1708,"00000000a",9);
  uStack_16ff = 0x61616161616161;
  uStack_16f8 = 0x62;
  builtin_strncpy(acStack_16f7,"bbbbbbb",8);
  lStack_1858.head = (list_elem *)0x0;
  lStack_1858.tail = (list_elem *)0x0;
  lVar12 = 0;
  do {
    sprintf(acStack_14a8,"metadata_%03zu",lVar12);
    sprintf(acStack_15a8,"body_%03zu",lVar12);
    uVar1 = _set_doc_bin(&dStack_1898,acStack_1708,lVar12 + 0x10,acStack_14a8,acStack_15a8);
    if (uVar1 == 0) {
      initial_load_test_incremental_prefix();
      goto LAB_00109996;
    }
    bVar6 = docio_append_doc(&dStack_1840,&dStack_1898,'\0','\0');
    plVar7 = (list_elem *)malloc(0x28);
    plVar9 = (list_elem *)(dStack_1898.length._0_8_ & 0xffff);
    plVar7[1].next = plVar9;
    plVar8 = (list_elem *)malloc((size_t)plVar9);
    plVar7[1].prev = plVar8;
    memcpy(plVar8,acStack_1708,(size_t)plVar9);
    plVar7[2].prev =
         (list_elem *)
         (bVar6 >> 0x38 | (bVar6 & 0xff000000000000) >> 0x28 | (bVar6 & 0xff0000000000) >> 0x18 |
          (bVar6 & 0xff00000000) >> 8 | (bVar6 & 0xff000000) << 8 | (bVar6 & 0xff0000) << 0x18 |
          (bVar6 & 0xff00) << 0x28 | bVar6 << 0x38);
    list_push_back(&lStack_1858,plVar7);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 8);
  pbVar10 = btreeblk_get_ops();
  hbtrie_init_and_load
            (&hStack_1778,8,8,0x1000,0xffffffffffffffff,&bStack_17f0,pbVar10,&dStack_1840,
             _readkey_wrap,8,initial_load_next,initial_load_get,initial_btreeblk_end,&lStack_1858);
  filemgr_commit(pfVar5,true,(err_log_callback *)0x0);
  printf("trie root bid %lu\n",hStack_1778.root_bid);
  lVar12 = 0;
  while( true ) {
    sprintf(acStack_14a8,"metadata_%03zu",lVar12);
    sprintf(acStack_15a8,"body_%03zu",lVar12);
    hVar2 = hbtrie_find(&hStack_1778,acStack_1708,(int)lVar12 + 0x10,&uStack_1848);
    btreeblk_end(&bStack_17f0);
    if (hVar2 == HBTRIE_RESULT_FAIL) break;
    docio_read_doc(&dStack_1840,
                   uStack_1848 >> 0x38 | (uStack_1848 & 0xff000000000000) >> 0x28 |
                   (uStack_1848 & 0xff0000000000) >> 0x18 | (uStack_1848 & 0xff00000000) >> 8 |
                   (uStack_1848 & 0xff000000) << 8 | (uStack_1848 & 0xff0000) << 0x18 |
                   (uStack_1848 & 0xff00) << 0x28 | uStack_1848 << 0x38,&dStack_1898,true);
    iVar3 = bcmp(dStack_1898.key,acStack_1708,dStack_1898.length._0_8_ & 0xffff);
    if (iVar3 != 0) {
      initial_load_test_incremental_prefix();
    }
    iVar3 = bcmp(dStack_1898.meta,acStack_14a8,(ulong)dStack_1898.length._0_8_ >> 0x10 & 0xffff);
    if (iVar3 != 0) {
      initial_load_test_incremental_prefix();
    }
    iVar3 = bcmp(dStack_1898.body,acStack_15a8,(ulong)dStack_1898.length._0_8_ >> 0x20);
    if (iVar3 != 0) {
      initial_load_test_incremental_prefix();
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 8) {
      hbtrie_free(&hStack_1778);
      docio_free(&dStack_1840);
      btreeblk_free(&bStack_17f0);
      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      plVar7 = lStack_1858.head;
      while (plVar7 != (list_elem *)0x0) {
        plVar8 = plVar7->next;
        free(plVar7[1].prev);
        free(plVar7);
        plVar7 = plVar8;
      }
      pcVar13 = "%s PASSED\n";
      if (initial_load_test_incremental_prefix()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar13,"initial load with tailing null test");
      return;
    }
  }
LAB_00109996:
  initial_load_test_incremental_prefix();
  basic_test();
  skew_basic_test();
  hbtrie_reverse_iterator_test();
  hbtrie_partial_update_test();
  iterator_start_key_greater_than_prefix_test();
  initial_load_test_single_common_prefix();
  initial_load_test_nested_common_prefix();
  initial_load_test_tailing_null();
  initial_load_test_incremental_prefix();
  return;
}

Assistant:

void initial_load_test_nested_common_prefix()
{
    TEST_INIT();

    int blocksize = 4096;
    uint64_t offset, _offset;
    uint32_t docsize;
    char dockey[256], meta[256], body[256];
    hbtrie_result r;

    int rr = system(SHELL_DEL " hbtrie_testfile");
    (void)rr;

    char keybuf[256], metabuf[256], bodybuf[256];
    struct docio_object doc;
    memset(&doc, 0, sizeof(struct docio_object));
    doc.key = (void*)keybuf;
    doc.meta = (void*)metabuf;
    doc.body = (void*)bodybuf;

    struct filemgr_config config;
    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = 0;
    config.flag = 0x0;
    config.options = FILEMGR_CREATE;
    config.chunksize = sizeof(uint64_t);
    config.num_wal_shards = 8;

    filemgr_open_result result = filemgr_open((char *) "./hbtrie_testfile",
                                              get_filemgr_ops(), &config, NULL);
    struct filemgr *file = result.file;
    struct docio_handle dhandle;
    docio_init(&dhandle, file, false);

    struct btreeblk_handle bhandle;
    btreeblk_init(&bhandle, file, blocksize);

    struct list entries;
    list_init(&entries);
    for (size_t ii = 0; ii < 10; ++ii) {
        for (size_t jj = 0; jj < 1000; ++jj) {
            sprintf(dockey, "00000000%08zu%08zuabc", ii, jj);
            sprintf(meta, "metadata_%03zu", jj);
            sprintf(body, "body_%03zu", jj);
            docsize = _set_doc(&doc, dockey, meta, body);
            TEST_CHK(docsize != 0);
            offset = docio_append_doc(&dhandle, &doc, 0, 0);
            _offset = _endian_encode(offset);

            struct initial_load_elem* ile =
                (struct initial_load_elem*)malloc(sizeof(struct initial_load_elem));
            ile->keylen = strlen(dockey);
            ile->key = (uint8_t*)malloc(ile->keylen);
            memcpy(ile->key, dockey, ile->keylen);
            memcpy(ile->value, &_offset, sizeof(_offset));
            list_push_back(&entries, &ile->le);
        }
    }

    struct hbtrie trie;
    hbtrie_init_and_load(&trie, 8, 8, blocksize, BLK_NOT_FOUND,
                         (void*)&bhandle, btreeblk_get_ops(),
                         (void*)&dhandle, _readkey_wrap,
                         10000,
                         initial_load_next, initial_load_get, initial_btreeblk_end,
                         &entries);

    filemgr_commit(file, true, NULL);
    DBG("trie root bid %" _F64 "\n", trie.root_bid);

    for (size_t ii = 0; ii < 10; ++ii) {
        for (size_t jj = 0; jj < 1000; ++jj) {
            sprintf(dockey, "00000000%08zu%08zuabc", ii, jj);
            sprintf(meta, "metadata_%03zu", jj);
            sprintf(body, "body_%03zu", jj);

            uint8_t valuebuf[8];
            r = hbtrie_find(&trie, (void*)dockey, strlen(dockey), (void*)valuebuf);
            btreeblk_end(&bhandle);
            TEST_CHK(r != HBTRIE_RESULT_FAIL);

            if (r != HBTRIE_RESULT_FAIL) {
                memcpy(&_offset, valuebuf, 8);
                _offset = _endian_decode(_offset);
                docio_read_doc(&dhandle, _offset, &doc, true);

                TEST_CHK(!memcmp(doc.key, dockey, doc.length.keylen));
                TEST_CHK(!memcmp(doc.meta, meta, doc.length.metalen));
                TEST_CHK(!memcmp(doc.body, body, doc.length.bodylen));
            }
        }
    }

    hbtrie_free(&trie);
    docio_free(&dhandle);
    btreeblk_free(&bhandle);

    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    struct list_elem* le = list_begin(&entries);
    while (le) {
        struct initial_load_elem* ile =
            _get_entry(le, struct initial_load_elem, le);
        le = list_next(le);
        free(ile->key);
        free(ile);
    }

    TEST_RESULT("initial load with nested common prefix test");
}